

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::interleave
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  float *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  
  if (in_stack_00000008 == 0) {
    anon_unknown_1::interleave<unsigned_char>
              ((uchar *)in_RDI,in_ESI,in_EDX,in_ECX,(uchar *)in_R8,in_R9D,in_stack_00000010);
  }
  else if (in_stack_00000008 - 1U < 2) {
    anon_unknown_1::interleave<unsigned_short>
              ((unsigned_short *)in_RDI,in_ESI,in_EDX,in_ECX,(unsigned_short *)in_R8,in_R9D,
               in_stack_00000010);
  }
  else if (in_stack_00000008 == 3) {
    anon_unknown_1::interleave<float>(in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9D,in_stack_00000010);
  }
  return;
}

Assistant:

void interleave(const void* src, int sstride, int uw, int vw,
                void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     interleave((const uint8_t*) src, sstride, uw, vw,
                                  (uint8_t*) dst, dstride, nchan); break;
    case dt_half:
    case dt_uint16:    interleave((const uint16_t*) src, sstride, uw, vw,
                                  (uint16_t*) dst, dstride, nchan); break;
    case dt_float:     interleave((const float*) src, sstride, uw, vw,
                                  (float*) dst, dstride, nchan); break;
    }
}